

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionFuncs.cpp
# Opt level: O1

void __thiscall slang::ast::builtins::Builtins::registerConversionFuncs(Builtins *this)

{
  SignedConversionFunction *local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_b0 [2];
  KnownSystemName local_a0;
  bool local_9a;
  undefined1 local_99;
  shared_ptr<slang::ast::SystemSubroutine> local_98;
  shared_ptr<slang::ast::SystemSubroutine> local_88;
  shared_ptr<slang::ast::SystemSubroutine> local_78;
  shared_ptr<slang::ast::SystemSubroutine> local_68;
  shared_ptr<slang::ast::SystemSubroutine> local_58;
  shared_ptr<slang::ast::SystemSubroutine> local_48;
  shared_ptr<slang::ast::SystemSubroutine> local_38;
  shared_ptr<slang::ast::SystemSubroutine> local_28;
  
  local_a0 = Signed;
  local_9a = true;
  local_b8 = (SignedConversionFunction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::SignedConversionFunction,std::allocator<slang::ast::builtins::SignedConversionFunction>,slang::parsing::KnownSystemName,bool>
            (a_Stack_b0,&local_b8,
             (allocator<slang::ast::builtins::SignedConversionFunction> *)&local_99,&local_a0,
             &local_9a);
  local_28.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_b8->super_SystemSubroutine;
  local_28.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = a_Stack_b0[0]._M_pi;
  local_b8 = (SignedConversionFunction *)0x0;
  a_Stack_b0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_28);
  if (local_28.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (a_Stack_b0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_b0[0]._M_pi);
  }
  local_a0 = Unsigned;
  local_9a = false;
  local_b8 = (SignedConversionFunction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::SignedConversionFunction,std::allocator<slang::ast::builtins::SignedConversionFunction>,slang::parsing::KnownSystemName,bool>
            (a_Stack_b0,&local_b8,
             (allocator<slang::ast::builtins::SignedConversionFunction> *)&local_99,&local_a0,
             &local_9a);
  local_38.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_b8->super_SystemSubroutine;
  local_38.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = a_Stack_b0[0]._M_pi;
  local_b8 = (SignedConversionFunction *)0x0;
  a_Stack_b0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_38);
  if (local_38.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (a_Stack_b0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_b0[0]._M_pi);
  }
  local_b8 = (SignedConversionFunction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::RtoIFunction,std::allocator<slang::ast::builtins::RtoIFunction>,slang::ast::builtins::Builtins&>
            (a_Stack_b0,(RtoIFunction **)&local_b8,
             (allocator<slang::ast::builtins::RtoIFunction> *)&local_a0,this);
  local_48.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_b8->super_SystemSubroutine;
  local_48.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = a_Stack_b0[0]._M_pi;
  local_b8 = (SignedConversionFunction *)0x0;
  a_Stack_b0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_48);
  if (local_48.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (a_Stack_b0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_b0[0]._M_pi);
  }
  local_b8 = (SignedConversionFunction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::ItoRFunction,std::allocator<slang::ast::builtins::ItoRFunction>>
            (a_Stack_b0,(ItoRFunction **)&local_b8,
             (allocator<slang::ast::builtins::ItoRFunction> *)&local_a0);
  local_58.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_b8->super_SystemSubroutine;
  local_58.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = a_Stack_b0[0]._M_pi;
  local_b8 = (SignedConversionFunction *)0x0;
  a_Stack_b0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_58);
  if (local_58.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (a_Stack_b0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_b0[0]._M_pi);
  }
  local_b8 = (SignedConversionFunction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::RealToBitsFunction,std::allocator<slang::ast::builtins::RealToBitsFunction>,slang::ast::builtins::Builtins&>
            (a_Stack_b0,(RealToBitsFunction **)&local_b8,
             (allocator<slang::ast::builtins::RealToBitsFunction> *)&local_a0,this);
  local_68.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_b8->super_SystemSubroutine;
  local_68.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = a_Stack_b0[0]._M_pi;
  local_b8 = (SignedConversionFunction *)0x0;
  a_Stack_b0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_68);
  if (local_68.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (a_Stack_b0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_b0[0]._M_pi);
  }
  local_b8 = (SignedConversionFunction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::BitsToRealFunction,std::allocator<slang::ast::builtins::BitsToRealFunction>,slang::ast::builtins::Builtins&>
            (a_Stack_b0,(BitsToRealFunction **)&local_b8,
             (allocator<slang::ast::builtins::BitsToRealFunction> *)&local_a0,this);
  local_78.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_b8->super_SystemSubroutine;
  local_78.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = a_Stack_b0[0]._M_pi;
  local_b8 = (SignedConversionFunction *)0x0;
  a_Stack_b0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_78);
  if (local_78.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (a_Stack_b0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_b0[0]._M_pi);
  }
  local_b8 = (SignedConversionFunction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::ShortRealToBitsFunction,std::allocator<slang::ast::builtins::ShortRealToBitsFunction>,slang::ast::builtins::Builtins&>
            (a_Stack_b0,(ShortRealToBitsFunction **)&local_b8,
             (allocator<slang::ast::builtins::ShortRealToBitsFunction> *)&local_a0,this);
  local_88.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_b8->super_SystemSubroutine;
  local_88.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = a_Stack_b0[0]._M_pi;
  local_b8 = (SignedConversionFunction *)0x0;
  a_Stack_b0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_88);
  if (local_88.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (a_Stack_b0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_b0[0]._M_pi);
  }
  local_b8 = (SignedConversionFunction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::BitsToShortRealFunction,std::allocator<slang::ast::builtins::BitsToShortRealFunction>,slang::ast::builtins::Builtins&>
            (a_Stack_b0,(BitsToShortRealFunction **)&local_b8,
             (allocator<slang::ast::builtins::BitsToShortRealFunction> *)&local_a0,this);
  local_98.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_b8->super_SystemSubroutine;
  local_98.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = a_Stack_b0[0]._M_pi;
  local_b8 = (SignedConversionFunction *)0x0;
  a_Stack_b0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_98);
  if (local_98.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (a_Stack_b0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_b0[0]._M_pi);
  }
  return;
}

Assistant:

void Builtins::registerConversionFuncs() {
    using parsing::KnownSystemName;

#define REGISTER(name, ...) addSystemSubroutine(std::make_shared<name##Function>(__VA_ARGS__))
    REGISTER(SignedConversion, KnownSystemName::Signed, true);
    REGISTER(SignedConversion, KnownSystemName::Unsigned, false);

    REGISTER(RtoI, *this);
    REGISTER(ItoR, );
    REGISTER(RealToBits, *this);
    REGISTER(BitsToReal, *this);
    REGISTER(ShortRealToBits, *this);
    REGISTER(BitsToShortReal, *this);
#undef REGISTER
}